

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msa_helper.c
# Opt level: O0

void helper_msa_adds_a_w_mips64(CPUMIPSState_conflict5 *env,uint32_t wd,uint32_t ws,uint32_t wt)

{
  fpr_t *pfVar1;
  fpr_t *pfVar2;
  fpr_t *pfVar3;
  int64_t iVar4;
  wr_t *pwt;
  wr_t *pws;
  wr_t *pwd;
  uint32_t wt_local;
  uint32_t ws_local;
  uint32_t wd_local;
  CPUMIPSState_conflict5 *env_local;
  
  pfVar1 = (env->active_fpu).fpr + wd;
  pfVar2 = (env->active_fpu).fpr + ws;
  pfVar3 = (env->active_fpu).fpr + wt;
  iVar4 = msa_adds_a_df(2,(long)(int)pfVar2->fs[0],(long)(int)pfVar3->fs[0]);
  pfVar1->fs[0] = (float32)iVar4;
  iVar4 = msa_adds_a_df(2,(long)(int)pfVar2->fs[1],(long)(int)pfVar3->fs[1]);
  pfVar1->fs[1] = (float32)iVar4;
  iVar4 = msa_adds_a_df(2,(long)(int)pfVar2->fs[2],(long)(int)pfVar3->fs[2]);
  pfVar1->fs[2] = (float32)iVar4;
  iVar4 = msa_adds_a_df(2,(long)(int)pfVar2->fs[3],(long)(int)pfVar3->fs[3]);
  pfVar1->fs[3] = (float32)iVar4;
  return;
}

Assistant:

void helper_msa_adds_a_w(CPUMIPSState *env,
                         uint32_t wd, uint32_t ws, uint32_t wt)
{
    wr_t *pwd = &(env->active_fpu.fpr[wd].wr);
    wr_t *pws = &(env->active_fpu.fpr[ws].wr);
    wr_t *pwt = &(env->active_fpu.fpr[wt].wr);

    pwd->w[0]  = msa_adds_a_df(DF_WORD, pws->w[0],  pwt->w[0]);
    pwd->w[1]  = msa_adds_a_df(DF_WORD, pws->w[1],  pwt->w[1]);
    pwd->w[2]  = msa_adds_a_df(DF_WORD, pws->w[2],  pwt->w[2]);
    pwd->w[3]  = msa_adds_a_df(DF_WORD, pws->w[3],  pwt->w[3]);
}